

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

int count_lines(FILE *fp)

{
  int iVar1;
  undefined1 local_38 [8];
  fpos_t orig_pos;
  int local_20;
  int ch;
  int ch_count;
  int lines;
  FILE *fp_local;
  
  ch = 0;
  local_20 = -1;
  if (fp == (FILE *)0x0) {
    fp_local._4_4_ = -1;
  }
  else {
    fgetpos((FILE *)fp,(fpos_t *)local_38);
    rewind((FILE *)fp);
    do {
      orig_pos.__state.__value.__wch = fgetc((FILE *)fp);
      local_20 = local_20 + 1;
      if (orig_pos.__state.__value.__wch == 10) {
        ch = ch + 1;
      }
    } while (orig_pos.__state.__value.__wch != 0xffffffff);
    fsetpos((FILE *)fp,(fpos_t *)local_38);
    if (0 < local_20) {
      ch = ch + 1;
    }
    iVar1 = ferror((FILE *)fp);
    if (iVar1 == 0) {
      fp_local._4_4_ = ch;
    }
    else {
      fp_local._4_4_ = -1;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int count_lines(FILE *fp) {
    int lines = 0;
    int ch_count = -1;
    int ch;

    fpos_t orig_pos;

    if (fp == NULL)
        return -1;

    fgetpos(fp, &orig_pos);
    rewind(fp);

    do {
        ch = fgetc(fp);
        ch_count++;
        if (ch == '\n')
            lines++;
    } while (ch != EOF);

    fsetpos(fp, &orig_pos);

    if (ch_count > 0)
        lines++;

    if (ferror(fp) != 0)
        return -1;

    return lines;
}